

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O3

int header_bin_be(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,
                 size_t *name_pad)

{
  byte bVar1;
  uint uVar2;
  mode_t mVar3;
  void *pvVar4;
  ulong s;
  int iVar5;
  
  (a->archive).archive_format = 0x10003;
  (a->archive).archive_format_name = "cpio (big-endian binary)";
  pvVar4 = __archive_read_ahead(a,0x1a,(ssize_t *)0x0);
  if (pvVar4 == (void *)0x0) {
    archive_set_error(&a->archive,0,"End of file trying to read next cpio header");
    iVar5 = -0x1e;
  }
  else {
    archive_entry_set_dev
              (entry,(ulong)(ushort)(*(ushort *)((long)pvVar4 + 2) << 8 |
                                    *(ushort *)((long)pvVar4 + 2) >> 8));
    archive_entry_set_ino
              (entry,(ulong)(ushort)(*(ushort *)((long)pvVar4 + 4) << 8 |
                                    *(ushort *)((long)pvVar4 + 4) >> 8));
    archive_entry_set_mode
              (entry,(uint)(ushort)(*(ushort *)((long)pvVar4 + 6) << 8 |
                                   *(ushort *)((long)pvVar4 + 6) >> 8));
    if (cpio->option_pwb != 0) {
      mVar3 = archive_entry_mode(entry);
      archive_entry_set_mode(entry,mVar3 & 0x6fff);
      mVar3 = archive_entry_mode(entry);
      if ((mVar3 & 0xf000) == 0) {
        mVar3 = archive_entry_mode(entry);
        archive_entry_set_mode(entry,mVar3 | 0x8000);
      }
    }
    archive_entry_set_uid
              (entry,(ulong)(ushort)(*(ushort *)((long)pvVar4 + 8) << 8 |
                                    *(ushort *)((long)pvVar4 + 8) >> 8));
    archive_entry_set_gid
              (entry,(ulong)(ushort)(*(ushort *)((long)pvVar4 + 10) << 8 |
                                    *(ushort *)((long)pvVar4 + 10) >> 8));
    archive_entry_set_nlink
              (entry,(uint)(ushort)(*(ushort *)((long)pvVar4 + 0xc) << 8 |
                                   *(ushort *)((long)pvVar4 + 0xc) >> 8));
    archive_entry_set_rdev
              (entry,(ulong)(ushort)(*(ushort *)((long)pvVar4 + 0xe) << 8 |
                                    *(ushort *)((long)pvVar4 + 0xe) >> 8));
    uVar2 = *(uint *)((long)pvVar4 + 0x10);
    iVar5 = 0;
    archive_entry_set_mtime
              (entry,(ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                            uVar2 << 0x18),0);
    bVar1 = *(byte *)((long)pvVar4 + 0x15);
    *namelength = (ulong)CONCAT11(*(undefined1 *)((long)pvVar4 + 0x14),bVar1);
    *name_pad = (ulong)(bVar1 & 1);
    uVar2 = *(uint *)((long)pvVar4 + 0x16);
    s = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    cpio->entry_bytes_remaining = s;
    archive_entry_set_size(entry,s);
    cpio->entry_padding = (ulong)((uint)cpio->entry_bytes_remaining & 1);
    __archive_read_consume(a,0x1a);
  }
  return iVar5;
}

Assistant:

static int
header_bin_be(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const unsigned char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_BIN_BE;
	a->archive.archive_format_name = "cpio (big-endian binary)";

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, bin_header_size, NULL);
	if (h == NULL) {
	    archive_set_error(&a->archive, 0,
		"End of file trying to read next cpio header");
	    return (ARCHIVE_FATAL);
	}

	/* Parse out binary fields. */
	header = (const unsigned char *)h;

	archive_entry_set_dev(entry, header[bin_dev_offset] * 256 + header[bin_dev_offset + 1]);
	archive_entry_set_ino(entry, header[bin_ino_offset] * 256 + header[bin_ino_offset + 1]);
	archive_entry_set_mode(entry, header[bin_mode_offset] * 256 + header[bin_mode_offset + 1]);
	if (cpio->option_pwb) {
		/* turn off random bits left over from V6 inode */
		archive_entry_set_mode(entry, archive_entry_mode(entry) & 067777);
		if ((archive_entry_mode(entry) & AE_IFMT) == 0)
			archive_entry_set_mode(entry, archive_entry_mode(entry) | AE_IFREG);
	}
	archive_entry_set_uid(entry, header[bin_uid_offset] * 256 + header[bin_uid_offset + 1]);
	archive_entry_set_gid(entry, header[bin_gid_offset] * 256 + header[bin_gid_offset + 1]);
	archive_entry_set_nlink(entry, header[bin_nlink_offset] * 256 + header[bin_nlink_offset + 1]);
	archive_entry_set_rdev(entry, header[bin_rdev_offset] * 256 + header[bin_rdev_offset + 1]);
	archive_entry_set_mtime(entry, be4(header + bin_mtime_offset), 0);
	*namelength = header[bin_namesize_offset] * 256 + header[bin_namesize_offset + 1];
	*name_pad = *namelength & 1; /* Pad to even. */

	cpio->entry_bytes_remaining = be4(header + bin_filesize_offset);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = cpio->entry_bytes_remaining & 1; /* Pad to even. */
	    __archive_read_consume(a, bin_header_size);
	return (ARCHIVE_OK);
}